

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::extreme_value_dist<float>::operator()(extreme_value_dist<float> *this,lcg64_shift *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (this->P).theta_;
  fVar2 = (this->P).eta_;
  fVar3 = utility::u01xx_traits<float,_1UL,_trng::lcg64_shift>::oo(r);
  fVar3 = logf(fVar3);
  fVar3 = logf(-fVar3);
  return fVar3 * fVar1 + fVar2;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.eta() + P.theta() * math::ln(-math::ln(utility::uniformoo<result_type>(r)));
    }